

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_type.hpp
# Opt level: O2

DataType __thiscall
csv::internals::_process_potential_exponential
          (internals *this,string_view exponential_part,longdouble *coeff,longdouble *out)

{
  longdouble lVar1;
  DataType DVar2;
  longdouble in_ST0;
  string_view in;
  longdouble local_28;
  
  in._M_len = exponential_part._M_len;
  local_28 = (longdouble)0;
  in._M_str = (char *)&local_28;
  DVar2 = data_type(this,in,(longdouble *)0x2e,(char)out);
  if ((uint)(DVar2 + ~CSV_STRING) < 5) {
    DVar2 = CSV_DOUBLE;
    if (coeff != (longdouble *)0x0) {
      lVar1 = *(longdouble *)exponential_part._M_str;
      pow10<long_double>(&local_28);
      *coeff = lVar1 * in_ST0;
    }
  }
  else {
    DVar2 = CSV_STRING;
  }
  return DVar2;
}

Assistant:

HEDLEY_PRIVATE CONSTEXPR_14
        DataType _process_potential_exponential(
            csv::string_view exponential_part,
            const long double& coeff,
            long double * const out) {
            long double exponent = 0;
            auto result = data_type(exponential_part, &exponent);

            // Exponents in scientific notation should not be decimal numbers
            if (result >= DataType::CSV_INT8 && result < DataType::CSV_DOUBLE) {
                if (out) *out = coeff * pow10(exponent);
                return DataType::CSV_DOUBLE;
            }

            return DataType::CSV_STRING;
        }